

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_write_attr_set_v2(BigAttrSet *attrset,char *basename)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  BigAttr *pBVar4;
  void *__ptr;
  char local_ea [2];
  int rt;
  char buf_1 [2];
  char buf [128];
  char *local_60;
  char *textual;
  int k;
  int j;
  uchar *adata;
  char *rawdata;
  int ldata;
  int itemsize;
  BigAttr *a;
  ptrdiff_t i;
  FILE *fattr;
  char *basename_local;
  BigAttrSet *attrset_local;
  
  attrset->dirty = 0;
  __stream = (FILE *)_big_file_open_a_file(basename,-3,"w",1);
  if (__stream == (FILE *)0x0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x621);
LAB_0010524e:
    attrset_local._4_4_ = -1;
  }
  else {
    for (a = (BigAttr *)0x0; a < (BigAttr *)attrset->listused; a = (BigAttr *)((long)&a->nmemb + 1))
    {
      pBVar4 = attrset->attrlist + (long)a;
      iVar2 = big_file_dtype_itemsize(pBVar4->dtype);
      iVar3 = iVar2 * pBVar4->nmemb;
      __ptr = malloc((long)(iVar3 * 2 + 1));
      pcVar1 = pBVar4->data;
      textual._4_4_ = 0;
      for (textual._0_4_ = 0; (int)textual < iVar3; textual._0_4_ = (int)textual + 1) {
        *(char *)((long)__ptr + (long)textual._4_4_) =
             attrset_write_attr_set_v2::conv[(int)((byte)pcVar1[(int)textual] / 0x10)];
        *(char *)((long)__ptr + (long)(textual._4_4_ + 1)) =
             attrset_write_attr_set_v2::conv[(int)((uint)(byte)pcVar1[(int)textual] % 0x10)];
        textual._4_4_ = textual._4_4_ + 2;
      }
      *(undefined1 *)((long)__ptr + (long)textual._4_4_) = 0;
      if (iVar3 < 0x81) {
        local_60 = (char *)malloc((long)(pBVar4->nmemb * 0x20 + 1));
        *local_60 = '\0';
        for (textual._4_4_ = 0; textual._4_4_ < pBVar4->nmemb; textual._4_4_ = textual._4_4_ + 1) {
          if ((pBVar4->dtype[1] == 'a') ||
             ((pBVar4->dtype[1] == 'S' &&
              (iVar3 = big_file_dtype_itemsize(pBVar4->dtype), iVar3 == 1)))) {
            local_ea[0] = pcVar1[textual._4_4_];
            local_ea[1] = 0;
            if (local_ea[0] == '\n') {
              strcat(local_60,"...");
              break;
            }
            if (local_ea[0] == '\0') break;
            strcat(local_60,local_ea);
          }
          else {
            big_file_dtype_format
                      ((char *)&rt,pBVar4->dtype,pcVar1 + textual._4_4_ * iVar2,(char *)0x0);
            strcat(local_60,(char *)&rt);
            if (textual._4_4_ != pBVar4->nmemb + -1) {
              strcat(local_60," ");
            }
          }
        }
      }
      else {
        local_60 = _strdup("... (Too Long) ");
      }
      iVar2 = fprintf(__stream,"%s %s %d %s #HUMANE [ %s ]\n",pBVar4->name,pBVar4->dtype,
                      (ulong)(uint)pBVar4->nmemb,__ptr,local_60);
      free(__ptr);
      free(local_60);
      if (iVar2 < 1) {
        _big_file_raise("Failed to write to file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x656);
        fclose(__stream);
        goto LAB_0010524e;
      }
    }
    fclose(__stream);
    attrset_local._4_4_ = 0;
  }
  return attrset_local._4_4_;
}

Assistant:

static int
attrset_write_attr_set_v2(BigAttrSet * attrset, const char * basename)
{
    static char conv[] = "0123456789ABCDEF";
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR_V2, "w", 1);
    RAISEIF(fattr == NULL,
            ex_open,
            NULL);

    ptrdiff_t i;
    for(i = 0; i < attrset->listused; i ++) {
        BigAttr * a = & attrset->attrlist[i];
        int itemsize = big_file_dtype_itemsize(a->dtype);
        int ldata = itemsize * a->nmemb;

        char * rawdata = malloc(ldata * 2 + 1);
        unsigned char * adata = (unsigned char*) a->data;
        int j, k; 
        for(j = 0, k = 0; k < ldata; k ++, j+=2) {
            rawdata[j] = conv[adata[k] / 16];
            rawdata[j + 1] = conv[adata[k] % 16];
        }
        rawdata[j] = 0;

        char * textual;
        /* skip textual representation for very long columns */
        if(ldata > 128) {
            textual = _strdup("... (Too Long) ");
        } else {
            textual = malloc(a->nmemb * 32 + 1);
            textual[0] = 0;
            for(j = 0; j < a->nmemb; j ++) {
                if(a->dtype[1] != 'a' &&
                  !(a->dtype[1] == 'S' && big_file_dtype_itemsize(a->dtype) == 1))
                {
                    char buf[128];
                    big_file_dtype_format(buf, a->dtype, &adata[j * itemsize], NULL);
                    strcat(textual, buf);
                    if(j != a->nmemb - 1) {
                        strcat(textual, " ");
                    }
                } else { /* pretty print string encoded as a1 or S1. */
                    char buf[] = {adata[j], 0};
                    if(buf[0] == '\n') {
                        strcat(textual, "...");
                        break;
                    } if(buf[0] == 0) {
                        break;
                    }
                    strcat(textual, buf);
                }
            }
        }
        int rt = fprintf(fattr, "%s %s %d %s #HUMANE [ %s ]\n", 
                a->name, a->dtype, a->nmemb, rawdata, textual
               );
        free(rawdata);
        free(textual);
        RAISEIF(rt <= 0,
            ex_write,
            "Failed to write to file");
    } 
    fclose(fattr);
    return 0;
ex_write:
    fclose(fattr);
ex_open:
    return -1;
}